

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O1

size_t Assimp::FBX::Util::DecodeBase64(char *in,size_t inLength,uint8_t *out,size_t maxOutLength)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  if (1 < inLength && maxOutLength != 0) {
    cVar1 = in[inLength - 1];
    cVar2 = in[inLength - 2];
    if (inLength - (cVar1 == '=') != (ulong)(cVar2 == '=')) {
      iVar7 = -8;
      lVar6 = 0;
      uVar8 = 0;
      sVar4 = 0;
      while( true ) {
        if ((long)in[lVar6] < 0) {
          bVar5 = 0xff;
        }
        else {
          bVar5 = base64DecodeTable[in[lVar6]];
        }
        iVar3 = iVar7;
        if (bVar5 != 0xff) {
          uVar8 = uVar8 * 0x40 + (uint)bVar5;
          iVar3 = iVar7 + 6;
          if (-7 < iVar7) {
            out[sVar4] = (uint8_t)((int)uVar8 >> ((byte)(iVar7 + 6) & 0x1f));
            sVar4 = sVar4 + 1;
            uVar8 = uVar8 & 0xfff;
            iVar3 = iVar7 + -2;
          }
        }
        iVar7 = iVar3;
        if (bVar5 == 0xff) break;
        lVar6 = lVar6 + 1;
        if ((inLength - (cVar2 == '=')) - (ulong)(cVar1 == '=') == lVar6) {
          return sVar4;
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

size_t DecodeBase64(const char* in, size_t inLength, uint8_t* out, size_t maxOutLength)
{
    if (maxOutLength == 0 || inLength < 2) {
        return 0;
    }
    const size_t realLength = inLength - size_t(in[inLength - 1] == '=') - size_t(in[inLength - 2] == '=');
    size_t dst_offset = 0;
    int val = 0, valb = -8;
    for (size_t src_offset = 0; src_offset < realLength; ++src_offset)
    {
        const uint8_t table_value = Util::DecodeBase64(in[src_offset]);
        if (table_value == 255)
        {
            return 0;
        }
        val = (val << 6) + table_value;
        valb += 6;
        if (valb >= 0)
        {
            out[dst_offset++] = static_cast<uint8_t>((val >> valb) & 0xFF);
            valb -= 8;
            val &= 0xFFF;
        }
    }
    return dst_offset;
}